

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O2

bool pstore::command_line::details::has_switches(option *self,options_container *all)

{
  option *poVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (_List_node_base *)all;
  do {
    do {
      do {
        p_Var3 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                    *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var3 == (_List_node_base *)all) goto LAB_001094ef;
        poVar1 = (option *)p_Var3[1]._M_next;
      } while (poVar1 == self);
      iVar2 = (*poVar1->_vptr_option[10])(poVar1);
    } while ((char)iVar2 != '\0');
    iVar2 = (*poVar1->_vptr_option[9])(poVar1);
  } while ((char)iVar2 != '\0');
LAB_001094ef:
  return p_Var3 != (_List_node_base *)all;
}

Assistant:

bool has_switches (option const * const self,
                                   option::options_container const & all) {
                    return std::any_of (
                        std::begin (all), std::end (all), [self] (option const * const op) {
                            return op != self && !op->is_alias () && !op->is_positional ();
                        });
                }